

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

void __thiscall
spirv_cross::ParsedIR::unset_member_decoration
          (ParsedIR *this,TypeID id,uint32_t index,Decoration decoration)

{
  ulong uVar1;
  size_t sVar2;
  Decoration *pDVar3;
  Decoration *dec;
  mapped_type *local_28;
  mapped_type *m;
  Decoration decoration_local;
  uint32_t index_local;
  ParsedIR *this_local;
  TypeID id_local;
  
  m._0_4_ = decoration;
  m._4_4_ = index;
  _decoration_local = this;
  this_local._4_4_ = id.id;
  TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)1>
            ((TypedID<(spirv_cross::Types)0> *)((long)&dec + 4),
             (TypedID<(spirv_cross::Types)1> *)((long)&this_local + 4));
  local_28 = ::std::
             unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
             ::operator[](&this->meta,(key_type *)((long)&dec + 4));
  uVar1 = (ulong)m._4_4_;
  sVar2 = VectorView<spirv_cross::Meta::Decoration>::size
                    (&(local_28->members).super_VectorView<spirv_cross::Meta::Decoration>);
  if (uVar1 < sVar2) {
    pDVar3 = VectorView<spirv_cross::Meta::Decoration>::operator[]
                       (&(local_28->members).super_VectorView<spirv_cross::Meta::Decoration>,
                        (ulong)m._4_4_);
    Bitset::clear(&pDVar3->decoration_flags,(Decoration)m);
    if ((Decoration)m == DecorationSpecId) {
      pDVar3->spec_id = 0;
    }
    else if ((Decoration)m == DecorationBuiltIn) {
      pDVar3->builtin = false;
    }
    else if ((Decoration)m == DecorationStream) {
      pDVar3->stream = 0;
    }
    else if ((Decoration)m == DecorationLocation) {
      pDVar3->location = 0;
    }
    else if ((Decoration)m == DecorationComponent) {
      pDVar3->component = 0;
    }
    else if ((Decoration)m == DecorationOffset) {
      pDVar3->offset = 0;
    }
    else if ((Decoration)m == DecorationXfbBuffer) {
      pDVar3->xfb_buffer = 0;
    }
    else if ((Decoration)m == DecorationXfbStride) {
      pDVar3->xfb_stride = 0;
    }
    else if ((Decoration)m == DecorationHlslSemanticGOOGLE) {
      ::std::__cxx11::string::clear();
    }
  }
  return;
}

Assistant:

void ParsedIR::unset_member_decoration(TypeID id, uint32_t index, Decoration decoration)
{
	auto &m = meta[id];
	if (index >= m.members.size())
		return;

	auto &dec = m.members[index];

	dec.decoration_flags.clear(decoration);
	switch (decoration)
	{
	case DecorationBuiltIn:
		dec.builtin = false;
		break;

	case DecorationLocation:
		dec.location = 0;
		break;

	case DecorationComponent:
		dec.component = 0;
		break;

	case DecorationOffset:
		dec.offset = 0;
		break;

	case DecorationXfbBuffer:
		dec.xfb_buffer = 0;
		break;

	case DecorationXfbStride:
		dec.xfb_stride = 0;
		break;

	case DecorationStream:
		dec.stream = 0;
		break;

	case DecorationSpecId:
		dec.spec_id = 0;
		break;

	case DecorationHlslSemanticGOOGLE:
		dec.hlsl_semantic.clear();
		break;

	default:
		break;
	}
}